

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definition.cpp
# Opt level: O0

void __thiscall
slang::ast::Definition::ParameterDecl::ParameterDecl
          (ParameterDecl *this,Scope *scope,TypeParameterDeclarationSyntax *syntax,
          TypeAssignmentSyntax *decl,bool isLocal,bool isPort)

{
  SourceLocation SVar1;
  string_view sVar2;
  size_t local_40;
  char *local_38;
  bool isPort_local;
  bool isLocal_local;
  TypeAssignmentSyntax *decl_local;
  TypeParameterDeclarationSyntax *syntax_local;
  Scope *scope_local;
  ParameterDecl *this_local;
  
  (this->field_0).typeSyntax = syntax;
  (this->field_1).typeDecl = decl;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&this->name);
  SourceLocation::SourceLocation(&this->location);
  this->isTypeParam = true;
  this->isLocalParam = isLocal;
  this->isPortParam = isPort;
  this->hasSyntax = true;
  sVar2 = parsing::Token::valueText(&decl->name);
  local_40 = sVar2._M_len;
  (this->name)._M_len = local_40;
  local_38 = sVar2._M_str;
  (this->name)._M_str = local_38;
  SVar1 = parsing::Token::location(&decl->name);
  this->location = SVar1;
  if (decl->assignment == (EqualsTypeClauseSyntax *)0x0) {
    if (isPort) {
      if (isLocal) {
        Scope::addDiag(scope,(DiagCode)0x4e0006,this->location);
      }
    }
    else {
      Scope::addDiag(scope,(DiagCode)0xb0006,this->location);
    }
  }
  return;
}

Assistant:

Definition::ParameterDecl::ParameterDecl(const Scope& scope,
                                         const TypeParameterDeclarationSyntax& syntax,
                                         const TypeAssignmentSyntax& decl, bool isLocal,
                                         bool isPort) :
    typeSyntax(&syntax),
    typeDecl(&decl), isTypeParam(true), isLocalParam(isLocal), isPortParam(isPort),
    hasSyntax(true) {

    name = decl.name.valueText();
    location = decl.name.location();

    if (!decl.assignment) {
        if (!isPort)
            scope.addDiag(diag::BodyParamNoInitializer, location);
        else if (isLocal)
            scope.addDiag(diag::LocalParamNoInitializer, location);
    }
}